

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.hpp
# Opt level: O3

void __thiscall zmq::blob_t::set_deep_copy(blob_t *this,blob_t *other_)

{
  uchar *__dest;
  size_t __size;
  
  if (this->_owned == true) {
    free(this->_data);
  }
  this->_data = (uchar *)0x0;
  this->_size = 0;
  __size = other_->_size;
  __dest = (uchar *)malloc(__size);
  this->_data = __dest;
  if (__dest == (uchar *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/blob.hpp"
            ,0x83);
    fflush(_stderr);
    zmq_abort("FATAL ERROR: OUT OF MEMORY");
    __size = other_->_size;
    __dest = this->_data;
  }
  this->_size = __size;
  this->_owned = true;
  memcpy(__dest,other_->_data,__size);
  return;
}

Assistant:

void set_deep_copy (blob_t const &other_)
    {
        clear ();
        _data = static_cast<unsigned char *> (malloc (other_._size));
        alloc_assert (_data);
        _size = other_._size;
        _owned = true;
        memcpy (_data, other_._data, _size);
    }